

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

Node * wasm::DataFlow::Node::makeCond(Node *block,Index index,Node *node)

{
  Node *this;
  Node *ret;
  Node *node_local;
  Index index_local;
  Node *block_local;
  
  this = (Node *)operator_new(0x30);
  Node(this,Cond);
  addValue(this,block);
  (this->field_1).index = index;
  addValue(this,node);
  return this;
}

Assistant:

static Node* makeCond(Node* block, Index index, Node* node) {
    Node* ret = new Node(Cond);
    ret->addValue(block);
    ret->index = index;
    ret->addValue(node);
    return ret;
  }